

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O3

void re2c::scc(dfa_t *dfa,
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              *stack,vector<unsigned_long,_std::allocator<unsigned_long>_> *lowlink,
              vector<bool,_std::allocator<bool>_> *trivial,size_t i)

{
  _Map_pointer ppuVar1;
  size_t *psVar2;
  size_t i_00;
  _Bit_type *p_Var3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  pointer puVar5;
  ulong uVar6;
  long lVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  bool bVar12;
  size_t local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  unsigned_long local_40;
  dfa_t *local_38;
  
  ppuVar1 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar8 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  uVar10 = ((long)(stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)puVar8 -
            (long)(stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)ppuVar1 -
                     (long)(stack->c).
                           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                           super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x40;
  (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[i] = uVar10;
  local_58 = i;
  local_48 = trivial;
  if (puVar8 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<unsigned_long,std::allocator<unsigned_long>> *)stack,&local_58);
  }
  else {
    *puVar8 = i;
    (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = puVar8 + 1;
  }
  psVar2 = (dfa->states).
           super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
           super__Vector_impl_data._M_start[local_58]->arcs;
  if (dfa->nchars == 0) {
    uVar6 = 0;
  }
  else {
    uVar11 = 0;
    local_50 = lowlink;
    local_40 = uVar10;
    local_38 = dfa;
    do {
      pvVar4 = local_50;
      i_00 = psVar2[uVar11];
      if (i_00 != 0xffffffffffffffff) {
        puVar5 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = puVar5[i_00];
        if (uVar6 == 0xfffffffffffffffe) {
          scc(dfa,stack,local_50,local_48,i_00);
          puVar5 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar6 = puVar5[i_00];
          dfa = local_38;
        }
        if (uVar6 < puVar5[local_58]) {
          puVar5[local_58] = uVar6;
        }
      }
      uVar11 = uVar11 + 1;
      uVar6 = dfa->nchars;
      uVar10 = local_40;
      lowlink = local_50;
    } while (uVar11 < uVar6);
  }
  if ((lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[local_58] != uVar10) {
    return;
  }
  puVar8 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar8 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    puVar8 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  if (local_58 == puVar8[-1]) {
    if (uVar6 == 0) {
      bVar12 = true;
      goto LAB_0012ff24;
    }
    if (*psVar2 != local_58) {
      uVar11 = 1;
      do {
        uVar9 = uVar11;
        if (uVar6 == uVar9) break;
        uVar11 = uVar9 + 1;
      } while (psVar2[uVar9] != local_58);
      bVar12 = uVar6 <= uVar9;
      goto LAB_0012ff24;
    }
  }
  bVar12 = false;
LAB_0012ff24:
  uVar6 = local_58 + 0x3f;
  if (-1 < (long)local_58) {
    uVar6 = local_58;
  }
  lVar7 = (long)uVar6 >> 6;
  p_Var3 = (local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar6 = (ulong)((local_58 & 0x800000000000003f) < 0x8000000000000001);
  uVar11 = 1L << ((byte)local_58 & 0x3f);
  if (bVar12) {
    uVar11 = uVar11 | p_Var3[lVar7 + uVar6 + 0xffffffffffffffff];
  }
  else {
    uVar11 = ~uVar11 & p_Var3[lVar7 + uVar6 + 0xffffffffffffffff];
  }
  p_Var3[lVar7 + uVar6 + 0xffffffffffffffff] = uVar11;
  do {
    puVar8 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar8 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar8 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    uVar10 = puVar8[-1];
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&stack->c);
    (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar10] = 0xffffffffffffffff;
  } while (uVar10 != local_58);
  return;
}

Assistant:

static void scc(
	const dfa_t &dfa,
	std::stack<size_t> &stack,
	std::vector<size_t> &lowlink,
	std::vector<bool> &trivial,
	size_t i)
{
	const size_t link = stack.size();
	lowlink[i] = link;
	stack.push(i);

	const size_t *arcs = dfa.states[i]->arcs;
	for (size_t c = 0; c < dfa.nchars; ++c)
	{
		const size_t j = arcs[c];
		if (j != dfa_t::NIL)
		{
			if (lowlink[j] == UNDEFINED)
			{
				scc(dfa, stack, lowlink, trivial, j);
			}
			if (lowlink[j] < lowlink[i])
			{
				lowlink[i] = lowlink[j];
			}
		}
	}

	if (lowlink[i] == link)
	{
		// SCC is non-trivial (has loops) iff it either:
		//   - consists of multiple nodes (they all must be interconnected)
		//   - consists of single node which loops back to itself
		trivial[i] = i == stack.top()
			&& !loopback(i, dfa.nchars, arcs);

		size_t j;
		do
		{
			j = stack.top();
			stack.pop();
			lowlink[j] = INFINITI;
		}
		while (j != i);
	}
}